

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplicationPrivate::dispatchEnterLeave(QWidget *enter,QWidget *leave,QPointF *globalPosF)

{
  QPointF arg;
  bool bVar1;
  uint uVar2;
  QWidget *pQVar3;
  QWidget *pQVar4;
  QGraphicsItem *this;
  qsizetype qVar5;
  const_reference ppQVar6;
  ulong uVar7;
  reference ppQVar8;
  QPointingDevice *pQVar9;
  QApplicationPrivate *pQVar10;
  long lVar11;
  QWidgetPrivate *pQVar12;
  QGraphicsProxyWidget *pQVar13;
  QPointF *in_RDX;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool bVar14;
  bool bVar15;
  qreal qVar16;
  QWidget *cursorWidget;
  QWidget *parent;
  QWidget *w_6;
  int i_1;
  QWidget *parentOfLeavingCursor;
  bool enterOnAlien;
  QWidget *w_5;
  QWidget *w_4;
  int i;
  QWidget *w_3;
  QWidget *w_2;
  QWidget *wleave;
  QWidget *wenter;
  QWidget *l;
  QWidget *e;
  int leaveDepth;
  int enterDepth;
  QWidget *w_1;
  QWidget *w;
  bool sameWindow;
  QHoverEvent he_1;
  QEnterEvent enterEvent;
  QPointF localPos;
  const_reverse_iterator end;
  const_reverse_iterator it;
  QPointF windowPos;
  QPointF globalPos;
  QHoverEvent he;
  QEvent leaveEvent;
  QWidgetList enterList;
  QWidgetList leaveList;
  parameter_type in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  WidgetAttribute in_stack_fffffffffffffcb4;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  byte bVar17;
  QWidget *in_stack_fffffffffffffcc0;
  QWidget *in_stack_fffffffffffffcc8;
  undefined7 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  QEvent *in_stack_fffffffffffffcd8;
  undefined6 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  QApplicationPrivate *in_stack_fffffffffffffce8;
  QWidget *in_stack_fffffffffffffcf8;
  QWidget *local_2e0;
  QWidget *local_2d8;
  int local_2c4;
  QWidget *local_2c0;
  int local_294;
  QWidget *local_290;
  QWidget *local_288;
  QWidget *local_280;
  QWidget *local_278;
  int local_260;
  int local_25c;
  QCursor local_228;
  qreal local_220;
  qreal local_218;
  undefined1 local_210 [24];
  QPointF local_1f8;
  QHoverEvent local_1e8 [96];
  undefined1 local_188 [24];
  QEnterEvent local_170 [80];
  QPointF local_120;
  undefined1 *local_110;
  undefined1 *local_108;
  QPointF local_100;
  QPointF local_f0;
  undefined1 local_e0 [24];
  QPointF local_c8;
  QPointF local_b8;
  QHoverEvent local_a8 [96];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QList<QWidget_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI == (QWidget *)0x0) && (in_RSI == (QWidget *)0x0)) || (in_RDI == in_RSI))
  goto LAB_002cf643;
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x2ce90b);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QWidget_*>::QList((QList<QWidget_*> *)0x2ce945);
  bVar14 = false;
  if ((in_RSI != (QWidget *)0x0) && (bVar14 = false, in_RDI != (QWidget *)0x0)) {
    pQVar3 = QWidget::window(in_stack_fffffffffffffcc0);
    pQVar4 = QWidget::window(in_stack_fffffffffffffcc0);
    bVar14 = pQVar3 == pQVar4;
  }
  if ((in_RSI != (QWidget *)0x0) && (!bVar14)) {
    do {
      QList<QWidget_*>::append((QList<QWidget_*> *)0x2ce9df,in_stack_fffffffffffffca8);
      bVar1 = QWidget::isWindow((QWidget *)
                                CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      bVar15 = false;
      if (!bVar1) {
        pQVar3 = QWidget::parentWidget((QWidget *)0x2cea06);
        bVar15 = pQVar3 != (QWidget *)0x0;
      }
    } while (bVar15);
  }
  if ((in_RDI != (QWidget *)0x0) && (!bVar14)) {
    do {
      QList<QWidget_*>::append((QList<QWidget_*> *)0x2cea5d,in_stack_fffffffffffffca8);
      bVar1 = QWidget::isWindow((QWidget *)
                                CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      bVar15 = false;
      if (!bVar1) {
        pQVar3 = QWidget::parentWidget((QWidget *)0x2cea84);
        bVar15 = pQVar3 != (QWidget *)0x0;
      }
    } while (bVar15);
  }
  if (bVar14) {
    local_25c = 0;
    local_260 = 0;
    while( true ) {
      bVar15 = QWidget::isWindow((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      bVar14 = false;
      if (!bVar15) {
        pQVar3 = QWidget::parentWidget((QWidget *)0x2ceafc);
        bVar14 = pQVar3 != (QWidget *)0x0;
      }
      if (!bVar14) break;
      local_25c = local_25c + 1;
    }
    while( true ) {
      bVar15 = QWidget::isWindow((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      bVar14 = false;
      if (!bVar15) {
        pQVar3 = QWidget::parentWidget((QWidget *)0x2ceb63);
        bVar14 = pQVar3 != (QWidget *)0x0;
      }
      local_278 = in_RDI;
      if (!bVar14) break;
      local_260 = local_260 + 1;
    }
    for (; local_280 = in_RSI, local_260 < local_25c; local_25c = local_25c + -1) {
      local_278 = QWidget::parentWidget((QWidget *)0x2cebd0);
    }
    for (; local_25c < local_260; local_260 = local_260 + -1) {
      local_280 = QWidget::parentWidget((QWidget *)0x2cec0a);
    }
    while (bVar14 = QWidget::isWindow((QWidget *)
                                      CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0))
          , local_288 = in_RSI, !bVar14 && local_278 != local_280) {
      local_278 = QWidget::parentWidget((QWidget *)0x2cec6f);
      local_280 = QWidget::parentWidget((QWidget *)0x2cec84);
    }
    while (local_290 = in_RDI, local_288 != local_280) {
      QList<QWidget_*>::append((QList<QWidget_*> *)0x2cecc5,in_stack_fffffffffffffca8);
      local_288 = QWidget::parentWidget((QWidget *)0x2cecd2);
    }
    while (local_290 != local_278) {
      QList<QWidget_*>::append((QList<QWidget_*> *)0x2ced13,in_stack_fffffffffffffca8);
      local_290 = QWidget::parentWidget((QWidget *)0x2ced20);
    }
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_48,Leave);
  local_294 = 0;
  while( true ) {
    this = (QGraphicsItem *)(long)local_294;
    qVar5 = QList<QWidget_*>::size(&local_20);
    if (qVar5 <= (long)this) break;
    ppQVar6 = QList<QWidget_*>::at
                        ((QList<QWidget_*> *)
                         CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         (qsizetype)in_stack_fffffffffffffca8);
    pQVar3 = *ppQVar6;
    pQVar4 = QApplication::activeModalWidget();
    if ((pQVar4 == (QWidget *)0x0) ||
       (bVar14 = tryModalHelper((QWidget *)
                                CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                                (QWidget **)
                                CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)),
       bVar14)) {
      QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)&local_48);
      bVar14 = QWidget::testAttribute
                         ((QWidget *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                          in_stack_fffffffffffffcb4);
      if (bVar14) {
        pQVar3 = QApplication::activePopupWidget();
        if (pQVar3 != (QWidget *)0x0) {
          in_stack_fffffffffffffcf8 = QApplication::activePopupWidget();
          pQVar3 = QWidget::window(in_stack_fffffffffffffcc0);
          if (in_stack_fffffffffffffcf8 != pQVar3) goto LAB_002cef39;
        }
        memcpy(local_a8,&DAT_00a9d078,0x60);
        QPointF::QPointF(&local_b8,-1.0,-1.0);
        local_c8 = QWidget::mapFromGlobal
                             ((QWidget *)
                              CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                              (QPointF *)in_stack_fffffffffffffcc8);
        uVar2 = QGuiApplication::keyboardModifiers();
        QString::QString((QString *)0x2ceeb8);
        in_stack_fffffffffffffca8 =
             (parameter_type)QPointingDevice::primaryPointingDevice((QString *)local_e0);
        QHoverEvent::QHoverEvent
                  (local_a8,HoverLeave,(QPointF *)&local_b8,(QPointF *)in_RDX,(QPointF *)&local_c8,
                   (QFlags_conflict1 *)(ulong)uVar2,(QPointingDevice *)in_stack_fffffffffffffca8);
        QString::~QString((QString *)0x2cef05);
        QCoreApplication::instance();
        QApplication::d_func((QApplication *)0x2cef12);
        notify_helper(in_stack_fffffffffffffce8,
                      (QObject *)
                      CONCAT17(in_stack_fffffffffffffce7,
                               CONCAT16(in_stack_fffffffffffffce6,in_stack_fffffffffffffce0)),
                      in_stack_fffffffffffffcd8);
        QHoverEvent::~QHoverEvent(local_a8);
      }
    }
LAB_002cef39:
    local_294 = local_294 + 1;
  }
  bVar14 = QList<QWidget_*>::isEmpty((QList<QWidget_*> *)0x2cef5e);
  if (!bVar14) {
    local_f0.xp = -NAN;
    local_f0.yp = -NAN;
    qVar16 = QPointF::x(in_RDX);
    uVar7 = qIsInf(qVar16);
    if ((uVar7 & 1) == 0) {
      local_f0.xp = in_RDX->xp;
      local_f0.yp = in_RDX->yp;
    }
    else {
      QPointF::QPointF(&local_f0,16777215.0,16777215.0);
    }
    local_100.yp = -NAN;
    local_100.xp = -NAN;
    QList<QWidget_*>::back((QList<QWidget_*> *)0x2cf000);
    QWidget::window(in_stack_fffffffffffffcc0);
    local_100 = QWidget::mapFromGlobal
                          ((QWidget *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                           (QPointF *)in_stack_fffffffffffffcc8);
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QWidget_*>::crbegin
              ((QList<QWidget_*> *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
    local_110 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QWidget_*>::crend
              ((QList<QWidget_*> *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
    while (bVar14 = std::operator!=((reverse_iterator<QList<QWidget_*>::const_iterator> *)
                                    CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                                    (reverse_iterator<QList<QWidget_*>::const_iterator> *)
                                    in_stack_fffffffffffffca8), bVar14) {
      ppQVar8 = std::reverse_iterator<QList<QWidget_*>::const_iterator>::operator*
                          ((reverse_iterator<QList<QWidget_*>::const_iterator> *)
                           CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      pQVar3 = *ppQVar8;
      pQVar4 = QApplication::activeModalWidget();
      if ((pQVar4 == (QWidget *)0x0) ||
         (bVar14 = tryModalHelper((QWidget *)
                                  CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                                  (QWidget **)
                                  CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)),
         bVar14)) {
        local_120.yp = -NAN;
        local_120.xp = -NAN;
        local_120 = QWidget::mapFromGlobal
                              ((QWidget *)
                               CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                               (QPointF *)in_stack_fffffffffffffcc8);
        memset(local_170,0xaa,0x50);
        QString::QString((QString *)0x2cf136);
        pQVar9 = (QPointingDevice *)QPointingDevice::primaryPointingDevice((QString *)local_188);
        QEnterEvent::QEnterEvent
                  (local_170,(QPointF *)&local_120,(QPointF *)&local_100,(QPointF *)&local_f0,pQVar9
                  );
        QString::~QString((QString *)0x2cf178);
        QCoreApplication::sendEvent(&pQVar3->super_QObject,(QEvent *)local_170);
        bVar14 = QWidget::testAttribute
                           ((QWidget *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8)
                            ,in_stack_fffffffffffffcb4);
        if (bVar14) {
          pQVar3 = QApplication::activePopupWidget();
          if (pQVar3 != (QWidget *)0x0) {
            in_stack_fffffffffffffce8 = (QApplicationPrivate *)QApplication::activePopupWidget();
            pQVar10 = (QApplicationPrivate *)QWidget::window(in_stack_fffffffffffffcc0);
            if (in_stack_fffffffffffffce8 != pQVar10) goto LAB_002cf2f2;
          }
          memcpy(local_1e8,&DAT_00a9d0d8,0x60);
          QPointF::QPointF(&local_1f8,-1.0,-1.0);
          uVar2 = QGuiApplication::keyboardModifiers();
          QString::QString((QString *)0x2cf225);
          in_stack_fffffffffffffca8 =
               (parameter_type)QPointingDevice::primaryPointingDevice((QString *)local_210);
          QHoverEvent::QHoverEvent
                    (local_1e8,HoverEnter,(QPointF *)&local_100,(QPointF *)&local_1f8,
                     (QPointF *)&local_f0,(QFlags_conflict1 *)(ulong)uVar2,
                     (QPointingDevice *)in_stack_fffffffffffffca8);
          QString::~QString((QString *)0x2cf275);
          QPointerEvent::point((longlong)local_1e8);
          local_220 = local_120.xp;
          local_218 = local_120.yp;
          arg.xp._4_4_ = in_stack_fffffffffffffcb4;
          arg.xp._0_4_ = in_stack_fffffffffffffcb0;
          arg.yp._0_7_ = in_stack_fffffffffffffcb8;
          arg.yp._7_1_ = in_stack_fffffffffffffcbf;
          QMutableEventPoint::setPosition((QEventPoint *)in_stack_fffffffffffffca8,arg);
          QCoreApplication::instance();
          QApplication::d_func((QApplication *)0x2cf2cd);
          notify_helper(in_stack_fffffffffffffce8,
                        (QObject *)
                        CONCAT17(in_stack_fffffffffffffce7,
                                 CONCAT16(in_stack_fffffffffffffce6,in_stack_fffffffffffffce0)),
                        in_stack_fffffffffffffcd8);
          QHoverEvent::~QHoverEvent(local_1e8);
        }
LAB_002cf2f2:
        QEnterEvent::~QEnterEvent(local_170);
      }
      std::reverse_iterator<QList<QWidget_*>::const_iterator>::operator++
                ((reverse_iterator<QList<QWidget_*>::const_iterator> *)
                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    }
  }
  bVar14 = false;
  if (in_RDI != (QWidget *)0x0) {
    bVar15 = isAlien((QWidget *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    bVar14 = true;
    if (!bVar15) {
      bVar14 = QWidget::testAttribute
                         ((QWidget *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                          in_stack_fffffffffffffcb4);
    }
  }
  local_2c0 = (QWidget *)0x0;
  local_2c4 = 0;
  while( true ) {
    lVar11 = (long)local_2c4;
    qVar5 = QList<QWidget_*>::size(&local_20);
    if (qVar5 <= lVar11) break;
    QList<QWidget_*>::at
              ((QList<QWidget_*> *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (qsizetype)in_stack_fffffffffffffca8);
    bVar15 = isAlien((QWidget *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    if (!bVar15) break;
    bVar15 = QWidget::testAttribute
                       ((QWidget *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
                        in_stack_fffffffffffffcb4);
    if (bVar15) {
      local_2d8 = QWidget::parentWidget((QWidget *)0x2cf408);
      while( true ) {
        bVar15 = false;
        if (local_2d8 != (QWidget *)0x0) {
          pQVar12 = QWidget::d_func((QWidget *)0x2cf42e);
          bVar15 = (*(uint *)&(pQVar12->data).field_0x10 >> 0x12 & 1) != 0;
        }
        if (!bVar15) break;
        local_2d8 = QWidget::parentWidget((QWidget *)0x2cf45b);
      }
      local_2c0 = local_2d8;
      in_stack_fffffffffffffcd7 = 0;
    }
    local_2c4 = local_2c4 + 1;
  }
  if (local_2c0 != (QWidget *)0x0) {
    if (bVar14 != false) {
      in_stack_fffffffffffffcc8 =
           (QWidget *)
           QWidget::effectiveWinId
                     ((QWidget *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
      pQVar3 = (QWidget *)
               QWidget::effectiveWinId
                         ((QWidget *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
      if (in_stack_fffffffffffffcc8 == pQVar3) goto LAB_002cf536;
    }
    QWidget::window(in_stack_fffffffffffffcc0);
    pQVar13 = QWidget::graphicsProxyWidget(in_stack_fffffffffffffca8);
    if (pQVar13 == (QGraphicsProxyWidget *)0x0) {
      in_stack_fffffffffffffcc0 = in_RDI;
      pQVar3 = desktop();
      bVar15 = SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0);
      if (in_stack_fffffffffffffcc0 == pQVar3) {
        qt_qpa_set_cursor((QWidget *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                          bVar15);
      }
      else {
        qt_qpa_set_cursor((QWidget *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                          bVar15);
      }
    }
  }
LAB_002cf536:
  local_2e0 = in_RDI;
  if (bVar14 != false) {
    while( true ) {
      bVar14 = QWidget::isWindow((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
      bVar17 = 0;
      if (!bVar14) {
        bVar14 = QWidget::isEnabled((QWidget *)0x2cf572);
        bVar17 = bVar14 ^ 0xff;
      }
      if ((bVar17 & 1) == 0) break;
      local_2e0 = QWidget::parentWidget((QWidget *)0x2cf58c);
    }
    if (local_2e0 != (QWidget *)0x0) {
      QWidget::window(in_stack_fffffffffffffcc0);
      pQVar13 = QWidget::graphicsProxyWidget(in_stack_fffffffffffffca8);
      if (pQVar13 == (QGraphicsProxyWidget *)0x0) {
        qt_qpa_set_cursor((QWidget *)CONCAT17(in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0),
                          SUB81((ulong)in_stack_fffffffffffffcc8 >> 0x38,0));
      }
      else {
        QWidgetPrivate::nearestGraphicsProxyWidget(in_stack_fffffffffffffca8);
        QWidget::cursor(in_stack_fffffffffffffcc8);
        QGraphicsItem::setCursor(this,(QCursor *)in_stack_fffffffffffffcf8);
        QCursor::~QCursor(&local_228);
      }
    }
  }
  QEvent::~QEvent((QEvent *)&local_48);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cf636);
  QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2cf643);
LAB_002cf643:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::dispatchEnterLeave(QWidget* enter, QWidget* leave, const QPointF &globalPosF)
{
    if ((!enter && !leave) || (enter == leave))
        return;

    QWidgetList leaveList;
    QWidgetList enterList;

    bool sameWindow = leave && enter && leave->window() == enter->window();
    if (leave && !sameWindow) {
        auto *w = leave;
        do {
            leaveList.append(w);
        } while (!w->isWindow() && (w = w->parentWidget()));
    }
    if (enter && !sameWindow) {
        auto *w = enter;
        do {
            enterList.append(w);
        } while (!w->isWindow() && (w = w->parentWidget()));
    }
    if (sameWindow) {
        int enterDepth = 0;
        int leaveDepth = 0;
        auto *e = enter;
        while (!e->isWindow() && (e = e->parentWidget()))
            enterDepth++;
        auto *l = leave;
        while (!l->isWindow() && (l = l->parentWidget()))
            leaveDepth++;
        QWidget* wenter = enter;
        QWidget* wleave = leave;
        while (enterDepth > leaveDepth) {
            wenter = wenter->parentWidget();
            enterDepth--;
        }
        while (leaveDepth > enterDepth) {
            wleave = wleave->parentWidget();
            leaveDepth--;
        }
        while (!wenter->isWindow() && wenter != wleave) {
            wenter = wenter->parentWidget();
            wleave = wleave->parentWidget();
        }

        for (auto *w = leave; w != wleave; w = w->parentWidget())
            leaveList.append(w);

        for (auto *w = enter; w != wenter; w = w->parentWidget())
            enterList.append(w);
    }

    QEvent leaveEvent(QEvent::Leave);
    for (int i = 0; i < leaveList.size(); ++i) {
        auto *w = leaveList.at(i);
        if (!QApplication::activeModalWidget() || QApplicationPrivate::tryModalHelper(w, nullptr)) {
            QCoreApplication::sendEvent(w, &leaveEvent);
            if (w->testAttribute(Qt::WA_Hover) &&
                (!QApplication::activePopupWidget() || QApplication::activePopupWidget() == w->window())) {
                Q_ASSERT(instance());
                QHoverEvent he(QEvent::HoverLeave, QPointF(-1, -1), globalPosF, w->mapFromGlobal(globalPosF),
                               QGuiApplication::keyboardModifiers());
                qApp->d_func()->notify_helper(w, &he);
            }
        }
    }
    if (!enterList.isEmpty()) {
        // Guard against QGuiApplicationPrivate::lastCursorPosition initialized to qInf(), qInf().
        const QPointF globalPos = qIsInf(globalPosF.x())
            ? QPointF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX)
            : globalPosF;
        const QPointF windowPos = std::as_const(enterList).back()->window()->mapFromGlobal(globalPos);
        for (auto it = enterList.crbegin(), end = enterList.crend(); it != end; ++it) {
            auto *w = *it;
            if (!QApplication::activeModalWidget() || QApplicationPrivate::tryModalHelper(w, nullptr)) {
                const QPointF localPos = w->mapFromGlobal(globalPos);
                QEnterEvent enterEvent(localPos, windowPos, globalPos);
                QCoreApplication::sendEvent(w, &enterEvent);
                if (w->testAttribute(Qt::WA_Hover) &&
                        (!QApplication::activePopupWidget() || QApplication::activePopupWidget() == w->window())) {
                    QHoverEvent he(QEvent::HoverEnter, windowPos, QPointF(-1, -1), globalPos,
                                   QGuiApplication::keyboardModifiers());
                    QMutableEventPoint::setPosition(he.point(0), localPos);
                    qApp->d_func()->notify_helper(w, &he);
                }
            }
        }
    }

#ifndef QT_NO_CURSOR
    // Update cursor for alien/graphics widgets.

    const bool enterOnAlien = (enter && (isAlien(enter) || enter->testAttribute(Qt::WA_DontShowOnScreen)));
    // Whenever we leave an alien widget on X11/QPA, we need to reset its nativeParentWidget()'s cursor.
    // This is not required on Windows as the cursor is reset on every single mouse move.
    QWidget *parentOfLeavingCursor = nullptr;
    for (int i = 0; i < leaveList.size(); ++i) {
        auto *w = leaveList.at(i);
        if (!isAlien(w))
            break;
        if (w->testAttribute(Qt::WA_SetCursor)) {
            QWidget *parent = w->parentWidget();
            while (parent && parent->d_func()->data.in_destructor)
                parent = parent->parentWidget();
            parentOfLeavingCursor = parent;
            //continue looping, we need to find the downest alien widget with a cursor.
            // (downest on the screen)
        }
    }
    //check that we will not call qt_x11_enforce_cursor twice with the same native widget
    if (parentOfLeavingCursor && (!enterOnAlien
        || parentOfLeavingCursor->effectiveWinId() != enter->effectiveWinId())) {
#if QT_CONFIG(graphicsview)
        if (!parentOfLeavingCursor->window()->graphicsProxyWidget())
#endif
        {
            if (enter == QApplicationPrivate::desktop()) {
                qt_qpa_set_cursor(enter, true);
            } else {
                qt_qpa_set_cursor(parentOfLeavingCursor, true);
            }
        }
    }
    if (enterOnAlien) {
        QWidget *cursorWidget = enter;
        while (!cursorWidget->isWindow() && !cursorWidget->isEnabled())
            cursorWidget = cursorWidget->parentWidget();

        if (!cursorWidget)
            return;

#if QT_CONFIG(graphicsview)
        if (cursorWidget->window()->graphicsProxyWidget()) {
            QWidgetPrivate::nearestGraphicsProxyWidget(cursorWidget)->setCursor(cursorWidget->cursor());
        } else
#endif
        {
            qt_qpa_set_cursor(cursorWidget, true);
        }
    }
#endif
}